

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

int is_builtin(char *key,int keylen)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  iVar2 = strncmp(key,"alloca",(long)keylen);
  if (iVar2 == 0) {
    uVar3 = 1;
  }
  else {
    lVar1 = 1;
    do {
      lVar4 = lVar1;
      if (lVar4 == 0x25) break;
      iVar2 = strncmp(key,is_builtin::builtins[lVar4],(long)keylen);
      lVar1 = lVar4 + 1;
    } while (iVar2 != 0);
    uVar3 = (uint)(lVar4 != 0x25);
  }
  return uVar3;
}

Assistant:

static int is_builtin(char *key, int keylen)
{
	static char *builtins[] = {"alloca",
				   "int64_t",
				   "lua_Number",
				   "lua_Integer",
				   "TValue",
				   "ivalue",
				   "setivalue",
				   "fvalue",
				   "setfltvalue",
				   "Ravi_Arr",
				   "arrvalue",
				   "ttisfulluserdata",
				   "ttislightuserdata",
				   "ttisstring",
				   "uvalue",
				   "pvalue",
				   "svalue",
				   "getudatamem",
				   "gco2u",
				   "sizeudata",
				   "vslen",
				   "R",
				   "Ravi_StringOrUserData",
				   "Ravi_IntegerArray",
				   "Ravi_NumberArray",
				   "raviX__error_code",
				   "LUA_TBOOLEAN",
				   "LUA_TNIL",
				   "LUA_TNUMBER",
				   "LUA_TUSERDATA",
				   "LUA_TLIGHTUSERDATA",
				   "LUA_TTHREAD",
				   "LUA_TTABLE",
				   "LUA_TFUNCTION",
				   "LUA_TSTRING",
				   "LUA_TTABLE",
				   "settt_",
				   NULL};
	for (int i = 0; builtins[i]; i++) {
		if (strncmp(key, builtins[i], keylen) == 0) {
			return 1;
		}
	}
	return 0;
}